

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O1

void __thiscall argo::pointer::build_from_json_string(pointer *this,string *pointer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  size_t *psVar4;
  bool bVar5;
  size_t start;
  size_t end;
  size_t local_70;
  token local_68;
  size_t local_38;
  
  local_70 = 0;
  local_38 = 0;
  if (pointer->_M_string_length == 0) {
    paVar1 = &local_68.m_name.field_2;
    local_68.m_type = all_e;
    local_68.m_name._M_string_length = 0;
    local_68.m_name.field_2._M_local_buf[0] = '\0';
    local_68.m_index = 0;
    local_68.m_name._M_dataplus._M_p = (pointer)paVar1;
    p_Var3 = (_List_node_base *)operator_new(0x40);
    *(type_t *)&p_Var3[1]._M_next = local_68.m_type;
    p_Var3[1]._M_prev = (_List_node_base *)&p_Var3[2]._M_prev;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_name._M_dataplus._M_p == paVar1) {
      p_Var3[2]._M_prev =
           (_List_node_base *)
           CONCAT71(local_68.m_name.field_2._M_allocated_capacity._1_7_,
                    local_68.m_name.field_2._M_local_buf[0]);
      p_Var3[3]._M_next = (_List_node_base *)local_68.m_name.field_2._8_8_;
    }
    else {
      p_Var3[1]._M_prev = (_List_node_base *)local_68.m_name._M_dataplus._M_p;
      p_Var3[2]._M_prev =
           (_List_node_base *)
           CONCAT71(local_68.m_name.field_2._M_allocated_capacity._1_7_,
                    local_68.m_name.field_2._M_local_buf[0]);
    }
    p_Var3[2]._M_next = (_List_node_base *)local_68.m_name._M_string_length;
    local_68.m_name._M_string_length = 0;
    local_68.m_name.field_2._M_local_buf[0] = '\0';
    p_Var3[3]._M_prev = (_List_node_base *)local_68.m_index;
    local_68.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar4 = &(this->m_path).
              super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>._M_impl.
              _M_node._M_size;
    *psVar4 = *psVar4 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.m_name._M_dataplus._M_p);
    }
  }
  else {
    uVar2 = pointer->_M_string_length;
    bVar5 = uVar2 != 0;
    if (bVar5) {
      paVar1 = &local_68.m_name.field_2;
      do {
        psVar4 = &local_70;
        do {
          local_38 = *psVar4 + 1;
          if (uVar2 <= local_38) break;
          psVar4 = &local_38;
        } while ((pointer->_M_dataplus)._M_p[local_38] != '/');
        if (!bVar5) {
          return;
        }
        translate_jsonp_token(&local_68,this,pointer,&local_70,&local_38);
        p_Var3 = (_List_node_base *)operator_new(0x40);
        *(type_t *)&p_Var3[1]._M_next = local_68.m_type;
        p_Var3[1]._M_prev = (_List_node_base *)&p_Var3[2]._M_prev;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.m_name._M_dataplus._M_p == paVar1) {
          p_Var3[2]._M_prev =
               (_List_node_base *)
               CONCAT71(local_68.m_name.field_2._M_allocated_capacity._1_7_,
                        local_68.m_name.field_2._M_local_buf[0]);
          p_Var3[3]._M_next = (_List_node_base *)local_68.m_name.field_2._8_8_;
        }
        else {
          p_Var3[1]._M_prev = (_List_node_base *)local_68.m_name._M_dataplus._M_p;
          p_Var3[2]._M_prev =
               (_List_node_base *)
               CONCAT71(local_68.m_name.field_2._M_allocated_capacity._1_7_,
                        local_68.m_name.field_2._M_local_buf[0]);
        }
        p_Var3[2]._M_next = (_List_node_base *)local_68.m_name._M_string_length;
        local_68.m_name._M_string_length = 0;
        local_68.m_name.field_2._M_local_buf[0] = '\0';
        p_Var3[3]._M_prev = (_List_node_base *)local_68.m_index;
        local_68.m_name._M_dataplus._M_p = (pointer)paVar1;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar4 = &(this->m_path).
                  super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>.
                  _M_impl._M_node._M_size;
        *psVar4 = *psVar4 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.m_name._M_dataplus._M_p != paVar1) {
          operator_delete(local_68.m_name._M_dataplus._M_p);
        }
        uVar2 = pointer->_M_string_length;
        bVar5 = local_70 < uVar2;
      } while (bVar5);
    }
  }
  return;
}

Assistant:

void pointer::build_from_json_string(const std::string &pointer)
{
    size_t start = 0;
    size_t end = 0;

    if (pointer.size() == 0)
    {
        m_path.push_back(token());
    }
    else
    {
        while (next_token(pointer, start, end))
        {
            m_path.push_back(translate_jsonp_token(pointer, start, end));
        }
    }
}